

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O1

void __thiscall
iutest::detail::iuValueArray<const_char_*,_const_char_*>::
make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
make_array(make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,_MyTuple *t)

{
  long lVar1;
  
  lVar1 = 0x10;
  do {
    *(long *)((long)this->val + lVar1 + -0x10) = (long)&this->val[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)this->val + lVar1 + -8) = 0;
    *(undefined1 *)((long)&this->val[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x50);
  tuples::detail::
  tuple_foreach_impl<const_std::tuple<const_char_*,_const_char_*>,_iutest::detail::iuValueArray<const_char_*,_const_char_*>::make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_0>
  ::impl<2,_0>::do_something(t,this);
  return;
}

Assistant:

explicit make_array(const _MyTuple& t)
        {
            tuples::tuple_foreach(t, *this);
        }